

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::GetCurrentExecutableDirectory_abi_cxx11_(void)

{
  reference pvVar1;
  string *psVar2;
  string *in_RDI;
  FilePath *in_stack_00000008;
  FilePath argv_0;
  FilePath *in_stack_ffffffffffffff70;
  undefined1 local_60 [96];
  
  psVar2 = (string *)local_60;
  internal::GetArgvs_abi_cxx11_();
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)psVar2,0);
  std::__cxx11::string::string((string *)(local_60 + 0x18),(string *)pvVar1);
  internal::FilePath::FilePath(in_stack_ffffffffffffff70,psVar2);
  std::__cxx11::string::~string((string *)(local_60 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff70);
  internal::FilePath::RemoveFileName(in_stack_00000008);
  psVar2 = internal::FilePath::string_abi_cxx11_((FilePath *)&stack0xffffffffffffff70);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar2);
  internal::FilePath::~FilePath((FilePath *)0x1ab755);
  internal::FilePath::~FilePath((FilePath *)0x1ab762);
  return in_RDI;
}

Assistant:

static std::string GetCurrentExecutableDirectory() {
  internal::FilePath argv_0(internal::GetArgvs()[0]);
  return argv_0.RemoveFileName().string();
}